

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_config_test.cc
# Opt level: O3

void __thiscall
anon_unknown.dwarf_257ea0::Av1Config_ReadWriteConfig_Test::TestBody
          (Av1Config_ReadWriteConfig_Test *this)

{
  undefined8 *puVar1;
  long lVar2;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  _Var3;
  SEARCH_METHODS *pSVar4;
  size_t bytes_read;
  uint8_t av1c_buffer [4];
  size_t bytes_written;
  Av1Config av1_config;
  AssertHelper local_78;
  internal local_70 [8];
  undefined8 *local_68;
  AssertHelper local_60;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_58;
  uint8_t local_4c [4];
  size_t local_48;
  Av1Config local_40;
  
  local_40.chroma_subsampling_x = '\0';
  local_40.chroma_subsampling_y = '\0';
  local_40.chroma_sample_position = '\0';
  local_40.initial_presentation_delay_present = '\0';
  local_40.initial_presentation_delay_minus_one = '\0';
  local_40.marker = '\0';
  local_40.version = '\0';
  local_40.seq_profile = '\0';
  local_40.seq_level_idx_0 = '\0';
  local_40.seq_tier_0 = '\0';
  local_40.high_bitdepth = '\0';
  local_40.twelve_bit = '\0';
  local_40.monochrome = '\0';
  local_48 = 0;
  local_4c[0] = '\0';
  local_4c[1] = '\0';
  local_4c[2] = '\0';
  local_4c[3] = '\0';
  local_58._M_head_impl = local_58._M_head_impl & 0xffffffff00000000;
  local_78.data_._0_4_ = write_av1config(&local_40,4,&local_48,local_4c);
  testing::internal::CmpHelperEQ<int,int>
            (local_70,"0",
             "write_av1config(&av1_config, sizeof(av1c_buffer), &bytes_written, &av1c_buffer[0])",
             (int *)&local_58,(int *)&local_78);
  puVar1 = local_68;
  if (local_70[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_58);
    if (local_68 == (undefined8 *)0x0) {
      pSVar4 = "";
    }
    else {
      pSVar4 = (SEARCH_METHODS *)*local_68;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/av1_config_test.cc"
               ,0x90,(char *)pSVar4);
    testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_58);
  }
  else {
    if (local_68 != (undefined8 *)0x0) {
      if ((undefined8 *)*local_68 != local_68 + 2) {
        operator_delete((undefined8 *)*local_68);
      }
      operator_delete(puVar1);
    }
    testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
              (local_70,"kAv1cNoConfigObusSize","bytes_written",
               &(anonymous_namespace)::kAv1cNoConfigObusSize,&local_48);
    puVar1 = local_68;
    if (local_70[0] != (internal)0x0) {
      if (local_68 != (undefined8 *)0x0) {
        if ((undefined8 *)*local_68 != local_68 + 2) {
          operator_delete((undefined8 *)*local_68);
        }
        operator_delete(puVar1);
      }
      lVar2 = 0;
      do {
        testing::internal::CmpHelperEQ<unsigned_char,unsigned_char>
                  (local_70,"kAv1cAllZero[i]","av1c_buffer[i]",
                   (uchar *)((long)&(anonymous_namespace)::kAv1cAllZero + lVar2),local_4c + lVar2);
        puVar1 = local_68;
        if (local_70[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_58);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(local_58._M_head_impl + 0x10),
                     "Mismatch in output Av1Config at offset=",0x27);
          std::ostream::_M_insert<unsigned_long>((ulong)(local_58._M_head_impl + 0x10));
          if (local_68 == (undefined8 *)0x0) {
            pSVar4 = "";
          }
          else {
            pSVar4 = (SEARCH_METHODS *)*local_68;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_78,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/av1_config_test.cc"
                     ,0x93,(char *)pSVar4);
          testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_58);
          goto LAB_0043b093;
        }
        if (local_68 != (undefined8 *)0x0) {
          if ((undefined8 *)*local_68 != local_68 + 2) {
            operator_delete((undefined8 *)*local_68);
          }
          operator_delete(puVar1);
        }
        lVar2 = lVar2 + 1;
      } while (lVar2 != 4);
      local_58._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      local_78.data_._0_4_ = 0;
      local_60.data_._0_4_ = read_av1config("",4,(size_t *)&local_58,&local_40);
      testing::internal::CmpHelperEQ<int,int>
                (local_70,"0",
                 "read_av1config(&kAv1cAllZero[0], sizeof(kAv1cAllZero), &bytes_read, &av1_config)",
                 (int *)&local_78,(int *)&local_60);
      puVar1 = local_68;
      if (local_70[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_78);
        if (local_68 == (undefined8 *)0x0) {
          pSVar4 = "";
        }
        else {
          pSVar4 = (SEARCH_METHODS *)*local_68;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_60,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/av1_config_test.cc"
                   ,0x9a,(char *)pSVar4);
        testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_78);
      }
      else {
        if (local_68 != (undefined8 *)0x0) {
          if ((undefined8 *)*local_68 != local_68 + 2) {
            operator_delete((undefined8 *)*local_68);
          }
          operator_delete(puVar1);
        }
        testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                  (local_70,"kAv1cNoConfigObusSize","bytes_read",
                   &(anonymous_namespace)::kAv1cNoConfigObusSize,(unsigned_long *)&local_58);
        puVar1 = local_68;
        if (local_70[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_78);
          if (local_68 == (undefined8 *)0x0) {
            pSVar4 = "";
          }
          else {
            pSVar4 = (SEARCH_METHODS *)*local_68;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_60,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/av1_config_test.cc"
                     ,0x9b,(char *)pSVar4);
          testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_78);
        }
        else {
          if (local_68 != (undefined8 *)0x0) {
            if ((undefined8 *)*local_68 != local_68 + 2) {
              operator_delete((undefined8 *)*local_68);
            }
            operator_delete(puVar1);
          }
          local_78.data_._0_4_ = 0;
          local_60.data_._0_4_ = write_av1config(&local_40,4,&local_48,local_4c);
          testing::internal::CmpHelperEQ<int,int>
                    (local_70,"0",
                     "write_av1config(&av1_config, sizeof(av1c_buffer), &bytes_written, &av1c_buffer[0])"
                     ,(int *)&local_78,(int *)&local_60);
          puVar1 = local_68;
          if (local_70[0] == (internal)0x0) {
            testing::Message::Message((Message *)&local_78);
            if (local_68 == (undefined8 *)0x0) {
              pSVar4 = "";
            }
            else {
              pSVar4 = (SEARCH_METHODS *)*local_68;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_60,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/av1_config_test.cc"
                       ,0x9d,(char *)pSVar4);
            testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_78);
          }
          else {
            if (local_68 != (undefined8 *)0x0) {
              if ((undefined8 *)*local_68 != local_68 + 2) {
                operator_delete((undefined8 *)*local_68);
              }
              operator_delete(puVar1);
            }
            lVar2 = 0;
            while (testing::internal::CmpHelperEQ<unsigned_char,unsigned_char>
                             (local_70,"kAv1cAllZero[i]","av1c_buffer[i]",
                              (uchar *)((long)&(anonymous_namespace)::kAv1cAllZero + lVar2),
                              local_4c + lVar2), puVar1 = local_68, local_70[0] != (internal)0x0) {
              if (local_68 != (undefined8 *)0x0) {
                if ((undefined8 *)*local_68 != local_68 + 2) {
                  operator_delete((undefined8 *)*local_68);
                }
                operator_delete(puVar1);
              }
              lVar2 = lVar2 + 1;
              if (lVar2 == 4) {
                return;
              }
            }
            testing::Message::Message((Message *)&local_78);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)(CONCAT44(local_78.data_._4_4_,(int)local_78.data_) + 0x10),
                       "Mismatch in output Av1Config at offset=",0x27);
            std::ostream::_M_insert<unsigned_long>
                      (CONCAT44(local_78.data_._4_4_,(int)local_78.data_) + 0x10);
            if (local_68 == (undefined8 *)0x0) {
              pSVar4 = "";
            }
            else {
              pSVar4 = (SEARCH_METHODS *)*local_68;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_60,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/av1_config_test.cc"
                       ,0x9f,(char *)pSVar4);
            testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_78);
          }
        }
      }
      testing::internal::AssertHelper::~AssertHelper(&local_60);
      _Var3._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           CONCAT44(local_78.data_._4_4_,(int)local_78.data_);
      goto LAB_0043b0a0;
    }
    testing::Message::Message((Message *)&local_58);
    if (local_68 == (undefined8 *)0x0) {
      pSVar4 = "";
    }
    else {
      pSVar4 = (SEARCH_METHODS *)*local_68;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/av1_config_test.cc"
               ,0x91,(char *)pSVar4);
    testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_58);
  }
LAB_0043b093:
  testing::internal::AssertHelper::~AssertHelper(&local_78);
  _Var3._M_head_impl = local_58._M_head_impl;
LAB_0043b0a0:
  if (_Var3._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)_Var3._M_head_impl + 8))();
  }
  if (local_68 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_68 != local_68 + 2) {
      operator_delete((undefined8 *)*local_68);
    }
    operator_delete(local_68);
  }
  return;
}

Assistant:

TEST(Av1Config, ReadWriteConfig) {
  Av1Config av1_config;
  memset(&av1_config, 0, sizeof(av1_config));

  // Test writing out the AV1 config.
  size_t bytes_written = 0;
  uint8_t av1c_buffer[4] = { 0 };
  ASSERT_EQ(0, write_av1config(&av1_config, sizeof(av1c_buffer), &bytes_written,
                               &av1c_buffer[0]));
  ASSERT_EQ(kAv1cNoConfigObusSize, bytes_written);
  for (size_t i = 0; i < kAv1cNoConfigObusSize; ++i) {
    ASSERT_EQ(kAv1cAllZero[i], av1c_buffer[i])
        << "Mismatch in output Av1Config at offset=" << i;
  }

  // Test reading the AV1 config.
  size_t bytes_read = 0;
  ASSERT_EQ(0, read_av1config(&kAv1cAllZero[0], sizeof(kAv1cAllZero),
                              &bytes_read, &av1_config));
  ASSERT_EQ(kAv1cNoConfigObusSize, bytes_read);
  ASSERT_EQ(0, write_av1config(&av1_config, sizeof(av1c_buffer), &bytes_written,
                               &av1c_buffer[0]));
  for (size_t i = 0; i < kAv1cNoConfigObusSize; ++i) {
    ASSERT_EQ(kAv1cAllZero[i], av1c_buffer[i])
        << "Mismatch in output Av1Config at offset=" << i;
  }
}